

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shortest-paths.hxx
# Opt level: O2

bool andres::graph::
     spsp<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>,lineage::ProblemGraph::SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               (Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *g,
               SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *mask,size_t vs,size_t vt,deque<unsigned_long,_std::allocator<unsigned_long>_> *path,
               vector<long,_std::allocator<long>_> *parents)

{
  pointer plVar1;
  pointer plVar2;
  ulong uVar3;
  pointer pRVar4;
  pointer pAVar5;
  unsigned_long uVar6;
  long lVar7;
  bool bVar8;
  pointer plVar9;
  size_type sVar10;
  unsigned_long vNegative;
  pointer pAVar11;
  ulong vPositive;
  ulong uVar12;
  long lVar13;
  size_t vs_local;
  size_type local_110;
  size_type local_108;
  queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *local_100;
  size_t vt_local;
  deque<unsigned_long,_std::allocator<unsigned_long>_> *local_f0;
  Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *local_e8;
  Value local_e0;
  queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> queues [2];
  
  vs_local = vs;
  vt_local = vt;
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::clear(path);
  bVar8 = lineage::ProblemGraph::
          SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::vertex(mask,vs);
  if ((bVar8) &&
     (bVar8 = lineage::ProblemGraph::
              SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::vertex(mask,vt), bVar8)) {
    if (vs == vt) {
      std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back(path,&vs_local);
      bVar8 = true;
    }
    else {
      std::vector<long,_std::allocator<long>_>::resize
                (parents,(long)(g->vertices_).
                               super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(g->vertices_).
                               super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5);
      plVar2 = (parents->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      plVar1 = (parents->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (plVar9 = plVar1; plVar9 != plVar2; plVar9 = plVar9 + 1) {
        *plVar9 = 0;
      }
      plVar1[vs_local] = vs_local + 1;
      plVar1[vt_local] = ~vt_local;
      std::queue<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
      queue<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>(queues);
      std::queue<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
      queue<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>(queues + 1);
      local_f0 = path;
      local_e8 = g;
      std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&queues[0].c,&vs_local);
      std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&queues[1].c,&vt_local);
      lVar13 = 0;
      while( true ) {
        local_100 = queues + lVar13;
        local_110 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_100->c);
        sVar10 = 0;
        while (sVar10 != local_110) {
          uVar3 = *(local_100->c).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_cur;
          local_108 = sVar10;
          std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_front(&local_100->c);
          pRVar4 = (local_e8->vertices_).
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pAVar11 = *(pointer *)
                     &pRVar4[uVar3].vector_.
                      super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
          ;
          pAVar5 = *(pointer *)
                    ((long)&pRVar4[uVar3].vector_.
                            super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                    + 8);
          uVar12 = ~uVar3;
          if (lVar13 == 0) {
            uVar12 = uVar3 + 1;
          }
          for (; pAVar11 != pAVar5; pAVar11 = pAVar11 + 1) {
            bVar8 = lineage::ProblemGraph::
                    SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::edge(mask,pAVar11->edge_);
            if ((bVar8) &&
               (bVar8 = lineage::ProblemGraph::
                        SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ::vertex(mask,pAVar11->vertex_), bVar8)) {
              uVar6 = pAVar11->vertex_;
              plVar1 = (parents->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              lVar7 = plVar1[uVar6];
              if (((lVar13 == 0) && (vNegative = uVar6, vPositive = uVar3, lVar7 < 0)) ||
                 ((lVar13 == 1 && (vNegative = uVar3, vPositive = uVar6, 0 < lVar7)))) {
                graph_detail::spspHelper<unsigned_long>(parents,vPositive,vNegative,local_f0);
                sVar10 = local_108;
                goto LAB_00136f11;
              }
              if (lVar7 == 0) {
                plVar1[uVar6] = uVar12;
                local_e0 = pAVar11->vertex_;
                std::deque<unsigned_long,_std::allocator<unsigned_long>_>::
                emplace_back<unsigned_long>(&local_100->c,&local_e0);
              }
            }
          }
          sVar10 = local_108 + 1;
        }
        if ((queues[0].c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur ==
             queues[0].c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur) &&
           (queues[1].c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur ==
            queues[1].c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur)) break;
        lVar13 = 1 - lVar13;
      }
LAB_00136f11:
      bVar8 = sVar10 < local_110;
      lVar13 = 0x50;
      do {
        std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
                  ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                   ((long)&queues[0].c.
                           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                           super__Deque_impl_data._M_map + lVar13));
        lVar13 = lVar13 + -0x50;
      } while (lVar13 != -0x50);
    }
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool 
spsp(
    const GRAPH& g, 
    const SUBGRAPH_MASK& mask,
    const std::size_t vs,
    const std::size_t vt,
    std::deque<std::size_t>& path,
    std::vector<std::ptrdiff_t>& parents// = std::vector<std::ptrdiff_t>()
) {
    path.clear();
    if(!mask.vertex(vs) || !mask.vertex(vt)) {
        return false;
    }
    if(vs == vt) {
        path.push_back(vs);
        return true;
    }
    parents.resize(g.numberOfVertices());
    std::fill(parents.begin(), parents.end(), 0);
    parents[vs] = vs + 1;
    parents[vt] = -static_cast<std::ptrdiff_t>(vt) - 1;
    std::queue<std::size_t> queues[2];
    queues[0].push(vs);
    queues[1].push(vt);
    for(std::size_t q = 0; true; q = 1 - q) { // infinite loop, alternating queues
        const std::size_t numberOfNodesAtFront = queues[q].size();
        for(std::size_t n = 0; n < numberOfNodesAtFront; ++n) {
            const std::size_t v = queues[q].front();
            queues[q].pop();
            typename GRAPH::AdjacencyIterator it;
            typename GRAPH::AdjacencyIterator end;
            if(q == 0) {
                it = g.adjacenciesFromVertexBegin(v);
                end = g.adjacenciesFromVertexEnd(v);
            }
            else {
                it = g.adjacenciesToVertexBegin(v);
                end = g.adjacenciesToVertexEnd(v);
            }
            for(; it != end; ++it) {
                if(!mask.edge(it->edge()) || !mask.vertex(it->vertex())) {
                    continue;
                }
                if(parents[it->vertex()] < 0 && q == 0) {
                    graph_detail::spspHelper(parents, v, it->vertex(), path);
                    assert(path[0] == vs);
                    assert(path.back() == vt);
                    return true;
                }
                else if(parents[it->vertex()] > 0 && q == 1) {
                    graph_detail::spspHelper(parents, it->vertex(), v, path);
                    assert(path[0] == vs);
                    assert(path.back() == vt);
                    return true;
                }
                else if(parents[it->vertex()] == 0) {
                    if(q == 0) {
                        parents[it->vertex()] = v + 1;
                    }
                    else {
                        parents[it->vertex()] = -static_cast<std::ptrdiff_t>(v) - 1;
                    }
                    queues[q].push(it->vertex());
                }
            }
        }
        if(queues[0].empty() && queues[1].empty()) {
            return false;
        }
    }
}